

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser.cc
# Opt level: O0

int ctemplate_htmlparser::htmlparser_attr_type(htmlparser_ctx *ctx)

{
  int iVar1;
  meta_redirect_type_enum mVar2;
  char *pcVar3;
  char *__s1;
  meta_redirect_type_enum redirect_type;
  char *value;
  char *attr;
  char *tag;
  htmlparser_ctx *ctx_local;
  
  iVar1 = htmlparser_in_attr(ctx);
  if (iVar1 == 0) {
    ctx_local._4_4_ = 0;
  }
  else if ((ctx->attr[0] == 'o') && (ctx->attr[1] == 'n')) {
    ctx_local._4_4_ = 3;
  }
  else {
    iVar1 = is_uri_attribute(ctx->attr);
    if (iVar1 == 0) {
      iVar1 = strcmp(ctx->attr,"style");
      if (iVar1 == 0) {
        ctx_local._4_4_ = 4;
      }
      else {
        pcVar3 = htmlparser_tag(ctx);
        __s1 = htmlparser_attr(ctx);
        if ((((pcVar3 != (char *)0x0) && (iVar1 = strcmp(pcVar3,"meta"), iVar1 == 0)) &&
            (__s1 != (char *)0x0)) && (iVar1 = strcmp(__s1,"content"), iVar1 == 0)) {
          pcVar3 = htmlparser_value(ctx);
          mVar2 = meta_redirect_type(pcVar3);
          if ((mVar2 == META_REDIRECT_TYPE_URL) || (mVar2 == META_REDIRECT_TYPE_URL_START)) {
            return 2;
          }
        }
        ctx_local._4_4_ = 1;
      }
    }
    else {
      ctx_local._4_4_ = 2;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

int htmlparser_attr_type(htmlparser_ctx *ctx)
{
    if (!htmlparser_in_attr(ctx))
        return HTMLPARSER_ATTR_NONE;

    if (is_js_attribute(ctx->attr))
        return HTMLPARSER_ATTR_JS;

    if (is_uri_attribute(ctx->attr))
        return HTMLPARSER_ATTR_URI;

    if (is_style_attribute(ctx->attr))
        return HTMLPARSER_ATTR_STYLE;

    const char* tag = htmlparser_tag(ctx);
    const char* attr = htmlparser_attr(ctx);

    /* Special logic to handle meta redirect type tags. */
    if (tag && strcmp(tag, "meta") == 0 &&
        attr && strcmp(attr, "content") == 0) {

      const char* value = htmlparser_value(ctx);
      meta_redirect_type_enum redirect_type = meta_redirect_type(value);

      if (redirect_type == META_REDIRECT_TYPE_URL ||
          redirect_type == META_REDIRECT_TYPE_URL_START)
        return HTMLPARSER_ATTR_URI;
    }

    return HTMLPARSER_ATTR_REGULAR;
}